

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

string * __thiscall
google::protobuf::UnknownFieldSet::AddLengthDelimited_abi_cxx11_(UnknownFieldSet *this,int number)

{
  iterator __position;
  vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>> *this_00;
  UnknownField local_28;
  
  this_00 = (vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>> *
            )this->fields_;
  if (this_00 ==
      (vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>> *)0x0)
  {
    this_00 = (vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>>
               *)operator_new(0x18);
    *(undefined8 *)&this_00->field_0x0 = 0;
    *(undefined8 *)(this_00 + 8) = 0;
    *(undefined8 *)(this_00 + 0x10) = 0;
    this->fields_ =
         (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
         this_00;
  }
  local_28._0_4_ = number & 0x1fffffffU | 0x60000000;
  local_28.field_2.group_ = (UnknownFieldSet *)operator_new(0x20);
  ((_Alloc_hider *)&(local_28.field_2.group_)->fields_)->_M_p =
       (pointer)(local_28.field_2.varint_ + 0x10);
  *(vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> **)
   (local_28.field_2.varint_ + 8) =
       (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
       0x0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)(local_28.field_2.varint_ + 0x10))->_M_local_buf[0] = '\0';
  __position._M_current = *(UnknownField **)(this_00 + 8);
  if (__position._M_current == *(UnknownField **)(this_00 + 0x10)) {
    std::vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>>::
    _M_realloc_insert<google::protobuf::UnknownField_const&>(this_00,__position,&local_28);
  }
  else {
    *(ulong *)__position._M_current = CONCAT44(local_28._4_4_,local_28._0_4_);
    ((__position._M_current)->field_2).group_ = (UnknownFieldSet *)local_28.field_2;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
  }
  return (string *)local_28.field_2.varint_;
}

Assistant:

string* UnknownFieldSet::AddLengthDelimited(int number) {
  if (fields_ == NULL) fields_ = new vector<UnknownField>;
  UnknownField field;
  field.number_ = number;
  field.type_ = UnknownField::TYPE_LENGTH_DELIMITED;
  field.length_delimited_.string_value_ = new string;
  fields_->push_back(field);
  return field.length_delimited_.string_value_;
}